

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Gluco::DoubleOption::parse(DoubleOption *this,char *str)

{
  double *pdVar1;
  bool bVar2;
  double dVar3;
  double tmp;
  char *end;
  char *span;
  char *str_local;
  DoubleOption *this_local;
  
  end = str;
  span = str;
  str_local = (char *)this;
  bVar2 = match<char_const*>(&end,"-");
  if (((bVar2) && (bVar2 = match<char_const*>(&end,(this->super_Option).name), bVar2)) &&
     (bVar2 = match<char_const*>(&end,"="), bVar2)) {
    dVar3 = strtod(end,(char **)&tmp);
    if (tmp == 0.0) {
      this_local._7_1_ = false;
    }
    else {
      if (((this->range).end <= dVar3) &&
         (((((this->range).end_inclusive & 1U) == 0 ||
           (pdVar1 = &(this->range).end, dVar3 != *pdVar1)) || (NAN(dVar3) || NAN(*pdVar1))))) {
        fprintf(_stderr,"ERROR! value <%s> is too large for option \"%s\".\n",end,
                (this->super_Option).name);
        exit(1);
      }
      if ((dVar3 <= (this->range).begin) &&
         (((((this->range).begin_inclusive & 1U) == 0 || (dVar3 != (this->range).begin)) ||
          (NAN(dVar3) || NAN((this->range).begin))))) {
        fprintf(_stderr,"ERROR! value <%s> is too small for option \"%s\".\n",end,
                (this->super_Option).name);
        exit(1);
      }
      this->value = dVar3;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool parse(const char* str){
        const char* span = str; 

        if (!match(span, "-") || !match(span, name) || !match(span, "="))
            return false;

        char*  end;
        double tmp = strtod(span, &end);

        if (end == NULL) 
            return false;
        else if (tmp >= range.end && (!range.end_inclusive || tmp != range.end)){
            fprintf(stderr, "ERROR! value <%s> is too large for option \"%s\".\n", span, name);
            exit(1);
        }else if (tmp <= range.begin && (!range.begin_inclusive || tmp != range.begin)){
            fprintf(stderr, "ERROR! value <%s> is too small for option \"%s\".\n", span, name);
            exit(1); }

        value = tmp;
        // fprintf(stderr, "READ VALUE: %g\n", value);

        return true;
    }